

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

bool __thiscall
caffe::PoolingParameter::MergePartialFromCodedStream(PoolingParameter *this,CodedInputStream *input)

{
  InternalMetadataWithArena *this_00;
  byte bVar1;
  void *pvVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  unsigned_long uVar6;
  byte *pbVar7;
  long lVar8;
  int64 iVar9;
  UnknownFieldSet *pUVar10;
  char cVar11;
  uint uVar12;
  ulong uVar13;
  pair<unsigned_long,_bool> pVar14;
  
  this_00 = &this->_internal_metadata_;
LAB_003b04ec:
  pbVar7 = input->buffer_;
  uVar5 = 0;
  if (pbVar7 < input->buffer_end_) {
    bVar1 = *pbVar7;
    uVar5 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_003b0510;
    input->buffer_ = pbVar7 + 1;
    uVar13 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_003b0510:
    uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
    uVar13 = 0;
    if (uVar5 - 1 < 0x7f) {
      uVar13 = 0x100000000;
    }
    uVar13 = uVar5 | uVar13;
  }
  uVar12 = (uint)uVar13;
  if ((uVar13 & 0x100000000) == 0) goto switchD_003b0584_default;
  cVar11 = (char)uVar13;
  switch((uint)(uVar13 >> 3) & 0x1fffffff) {
  case 1:
    if (cVar11 == '\b') {
      pbVar7 = input->buffer_;
      if (pbVar7 < input->buffer_end_) {
        bVar1 = *pbVar7;
        uVar5 = (uint32)bVar1;
        uVar12 = (uint)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003b0860;
        input->buffer_ = pbVar7 + 1;
      }
      else {
        uVar5 = 0;
LAB_003b0860:
        iVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
        uVar12 = (uint)iVar9;
        if (iVar9 < 0) {
          return false;
        }
      }
      if (uVar12 < 3) {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        this->pool_ = uVar12;
      }
      else {
        pvVar2 = (this_00->
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 ).ptr_;
        if (((ulong)pvVar2 & 1) == 0) {
          pUVar10 = google::protobuf::internal::
                    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                    ::mutable_unknown_fields_slow
                              (&this_00->
                                super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                              );
        }
        else {
          pUVar10 = (UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe);
        }
        google::protobuf::UnknownFieldSet::AddVarint(pUVar10,1,(long)(int)uVar12);
      }
      goto LAB_003b04ec;
    }
    break;
  case 2:
    if (cVar11 != '\x10') break;
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
    pbVar7 = input->buffer_;
    if (pbVar7 < input->buffer_end_) {
      bVar1 = *pbVar7;
      uVar5 = (uint32)bVar1;
      if (-1 < (char)bVar1) {
        this->kernel_size_ = (uint)bVar1;
LAB_003b07c5:
        input->buffer_ = pbVar7 + 1;
        goto LAB_003b04ec;
      }
    }
    else {
      uVar5 = 0;
    }
    lVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
    this->kernel_size_ = (uint32)lVar8;
LAB_003b0931:
    if (lVar8 < 0) {
      return false;
    }
    goto LAB_003b04ec;
  case 3:
    if (cVar11 == '\x18') {
      pbVar7 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar7 = *pbVar7 | 8;
      pbVar7 = input->buffer_;
      if (pbVar7 < input->buffer_end_) {
        bVar1 = *pbVar7;
        uVar5 = (uint32)bVar1;
        if (-1 < (char)bVar1) {
          this->stride_ = (uint)bVar1;
          goto LAB_003b07c5;
        }
      }
      else {
        uVar5 = 0;
      }
      lVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
      this->stride_ = (uint32)lVar8;
      goto LAB_003b0931;
    }
    break;
  case 4:
    if (cVar11 == ' ') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      pbVar7 = input->buffer_;
      if (pbVar7 < input->buffer_end_) {
        bVar1 = *pbVar7;
        uVar5 = (uint32)bVar1;
        if (-1 < (char)bVar1) {
          this->pad_ = (uint)bVar1;
          goto LAB_003b07c5;
        }
      }
      else {
        uVar5 = 0;
      }
      lVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
      this->pad_ = (uint32)lVar8;
      goto LAB_003b0931;
    }
    break;
  case 5:
    if (cVar11 == '(') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      pbVar7 = input->buffer_;
      if (pbVar7 < input->buffer_end_) {
        bVar1 = *pbVar7;
        uVar5 = (uint32)bVar1;
        if (-1 < (char)bVar1) {
          this->kernel_h_ = (uint)bVar1;
          goto LAB_003b07c5;
        }
      }
      else {
        uVar5 = 0;
      }
      lVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
      this->kernel_h_ = (uint32)lVar8;
      goto LAB_003b0931;
    }
    break;
  case 6:
    if (cVar11 == '0') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      pbVar7 = input->buffer_;
      if (pbVar7 < input->buffer_end_) {
        bVar1 = *pbVar7;
        uVar5 = (uint32)bVar1;
        if (-1 < (char)bVar1) {
          this->kernel_w_ = (uint)bVar1;
          goto LAB_003b07c5;
        }
      }
      else {
        uVar5 = 0;
      }
      lVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
      this->kernel_w_ = (uint32)lVar8;
      goto LAB_003b0931;
    }
    break;
  case 7:
    if (cVar11 == '8') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
      pbVar7 = input->buffer_;
      if (pbVar7 < input->buffer_end_) {
        bVar1 = *pbVar7;
        uVar5 = (uint32)bVar1;
        if (-1 < (char)bVar1) {
          this->stride_h_ = (uint)bVar1;
          goto LAB_003b07c5;
        }
      }
      else {
        uVar5 = 0;
      }
      lVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
      this->stride_h_ = (uint32)lVar8;
      goto LAB_003b0931;
    }
    break;
  case 8:
    if (cVar11 == '@') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x40;
      pbVar7 = input->buffer_;
      if (pbVar7 < input->buffer_end_) {
        bVar1 = *pbVar7;
        uVar5 = (uint32)bVar1;
        if (-1 < (char)bVar1) {
          this->stride_w_ = (uint)bVar1;
          goto LAB_003b07c5;
        }
      }
      else {
        uVar5 = 0;
      }
      lVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
      this->stride_w_ = (uint32)lVar8;
      goto LAB_003b0931;
    }
    break;
  case 9:
    if (cVar11 == 'H') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x80;
      pbVar7 = input->buffer_;
      if (pbVar7 < input->buffer_end_) {
        bVar1 = *pbVar7;
        uVar5 = (uint32)bVar1;
        if (-1 < (char)bVar1) {
          this->pad_h_ = (uint)bVar1;
          goto LAB_003b07c5;
        }
      }
      else {
        uVar5 = 0;
      }
      lVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
      this->pad_h_ = (uint32)lVar8;
      goto LAB_003b0931;
    }
    break;
  case 10:
    if (cVar11 == 'P') {
      pbVar7 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar7 = *pbVar7 | 1;
      pbVar7 = input->buffer_;
      if (pbVar7 < input->buffer_end_) {
        bVar1 = *pbVar7;
        uVar5 = (uint32)bVar1;
        if (-1 < (char)bVar1) {
          this->pad_w_ = (uint)bVar1;
          goto LAB_003b07c5;
        }
      }
      else {
        uVar5 = 0;
      }
      lVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
      this->pad_w_ = (uint32)lVar8;
      goto LAB_003b0931;
    }
    break;
  case 0xb:
    if (cVar11 == 'X') {
      pbVar7 = input->buffer_;
      if (pbVar7 < input->buffer_end_) {
        bVar1 = *pbVar7;
        uVar5 = (uint32)bVar1;
        uVar12 = (uint)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003b08df;
        input->buffer_ = pbVar7 + 1;
      }
      else {
        uVar5 = 0;
LAB_003b08df:
        iVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
        uVar12 = (uint)iVar9;
        if (iVar9 < 0) {
          return false;
        }
      }
      if (uVar12 < 3) {
        pbVar7 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar7 = *pbVar7 | 2;
        this->engine_ = uVar12;
      }
      else {
        pvVar2 = (this_00->
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 ).ptr_;
        if (((ulong)pvVar2 & 1) == 0) {
          pUVar10 = google::protobuf::internal::
                    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                    ::mutable_unknown_fields_slow
                              (&this_00->
                                super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                              );
        }
        else {
          pUVar10 = (UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe);
        }
        google::protobuf::UnknownFieldSet::AddVarint(pUVar10,0xb,(long)(int)uVar12);
      }
      goto LAB_003b04ec;
    }
    break;
  case 0xc:
    if (cVar11 == '`') {
      pbVar7 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar7 = *pbVar7 | 4;
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (uVar6 = (unsigned_long)(char)*puVar3, -1 < (long)uVar6))
      {
        input->buffer_ = puVar3 + 1;
      }
      else {
        pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar6 = pVar14.first;
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->global_pooling_ = uVar6 != 0;
      goto LAB_003b04ec;
    }
  }
switchD_003b0584_default:
  if (uVar12 == 0) {
    return true;
  }
  if ((uVar12 & 7) == 4) {
    return true;
  }
  pvVar2 = (this_00->
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ).ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    pUVar10 = google::protobuf::internal::
              InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ::mutable_unknown_fields_slow
                        (&this_00->
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        );
  }
  else {
    pUVar10 = (UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe);
  }
  bVar4 = google::protobuf::internal::WireFormat::SkipField(input,uVar12,pUVar10);
  if (!bVar4) {
    return false;
  }
  goto LAB_003b04ec;
}

Assistant:

bool PoolingParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.PoolingParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional .caffe.PoolingParameter.PoolMethod pool = 1 [default = MAX];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::PoolingParameter_PoolMethod_IsValid(value)) {
            set_pool(static_cast< ::caffe::PoolingParameter_PoolMethod >(value));
          } else {
            mutable_unknown_fields()->AddVarint(1, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 kernel_size = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_kernel_size();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &kernel_size_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 stride = 3 [default = 1];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_stride();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &stride_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 pad = 4 [default = 0];
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          set_has_pad();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &pad_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 kernel_h = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_kernel_h();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &kernel_h_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 kernel_w = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          set_has_kernel_w();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &kernel_w_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 stride_h = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(56u)) {
          set_has_stride_h();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &stride_h_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 stride_w = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(64u)) {
          set_has_stride_w();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &stride_w_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 pad_h = 9 [default = 0];
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(72u)) {
          set_has_pad_h();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &pad_h_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 pad_w = 10 [default = 0];
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          set_has_pad_w();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &pad_w_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.PoolingParameter.Engine engine = 11 [default = DEFAULT];
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(88u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::PoolingParameter_Engine_IsValid(value)) {
            set_engine(static_cast< ::caffe::PoolingParameter_Engine >(value));
          } else {
            mutable_unknown_fields()->AddVarint(11, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool global_pooling = 12 [default = false];
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(96u)) {
          set_has_global_pooling();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &global_pooling_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.PoolingParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.PoolingParameter)
  return false;
#undef DO_
}